

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Class.cpp
# Opt level: O0

void __thiscall hdc::Class::Class(Class *this)

{
  Class *this_local;
  
  ASTNode::ASTNode(&this->super_ASTNode);
  (this->super_ASTNode)._vptr_ASTNode = (_func_int **)&PTR_accept_00220aa0;
  Token::Token(&this->name);
  std::vector<hdc::ClassVariable_*,_std::allocator<hdc::ClassVariable_*>_>::vector(&this->variables)
  ;
  std::vector<hdc::Def_*,_std::allocator<hdc::Def_*>_>::vector(&this->methods);
  std::vector<hdc::Def_*,_std::allocator<hdc::Def_*>_>::vector(&this->constructors);
  this->classVariableCounter = 0;
  this->methodCounter = 0;
  this->id = 0;
  this->globalId = 0;
  this->superClass = (NamedType *)0x0;
  this->file = (SourceFile *)0x0;
  this->selfType = (NamedType *)0x0;
  this->destructor = (Def *)0x0;
  this->symbolTable = (SymbolTable *)0x0;
  ASTNode::setKind(&this->super_ASTNode,AST_CLASS);
  return;
}

Assistant:

Class::Class() {
    classVariableCounter = 0;
    methodCounter = 0;
    id = 0;
    globalId = 0;

    superClass = nullptr;
    file = nullptr;
    selfType = nullptr;
    destructor = nullptr;
    symbolTable = nullptr;

    setKind(AST_CLASS);
}